

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O0

void __thiscall cmCTestGlobalVC::WriteXMLGlobal(cmCTestGlobalVC *this,cmXMLWriter *xml)

{
  cmXMLWriter *pcVar1;
  bool bVar2;
  ulong uVar3;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xml_local;
  cmCTestGlobalVC *this_local;
  
  local_18 = xml;
  xml_local = (cmXMLWriter *)this;
  uVar3 = std::__cxx11::string::empty();
  pcVar1 = local_18;
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Revision",&local_39);
    cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_38,&this->NewRevision);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (bVar2 = std::operator!=(&this->OldRevision,&this->NewRevision), pcVar1 = local_18, bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"PriorRevision",&local_71);
    cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_70,&this->OldRevision);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return;
}

Assistant:

void cmCTestGlobalVC::WriteXMLGlobal(cmXMLWriter& xml)
{
  if(!this->NewRevision.empty())
    {
    xml.Element("Revision", this->NewRevision);
    }
  if(!this->OldRevision.empty() && this->OldRevision != this->NewRevision)
    {
    xml.Element("PriorRevision", this->OldRevision);
    }
}